

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

FILE * print_prep(int table,int update)

{
  int iVar1;
  int *piVar2;
  FILE *pFVar3;
  char *pcVar4;
  char *pcVar5;
  FILE *pFVar6;
  int unaff_EBX;
  char *__format;
  char upath [128];
  char local_a8 [136];
  
  if (updates == 0) {
    pFVar3 = tbl_open(table,"w");
    if (pFVar3 != (FILE *)0x0) {
      return pFVar3;
    }
    print_prep_cold_1();
  }
  else {
    unaff_EBX = update;
    if (0 < update) {
      if (insert_segments == 0) {
        pcVar5 = env_config("DSS_PATH",".");
        pcVar4 = tdefs[table].name;
        __format = "%s%c%s.u%d";
      }
      else {
        iVar1 = strcmp(tdefs[table].name,"orders.tbl");
        if (iVar1 == 0) {
          piVar2 = &insert_lineitem_segment;
        }
        else {
          piVar2 = &insert_orders_segment;
        }
        *piVar2 = *piVar2 + 1;
        pcVar5 = env_config("DSS_PATH",".");
        pcVar4 = tdefs[table].name;
        update = (uint)update % 10000;
        __format = "%s%c%s.u%d.%d";
      }
      sprintf(local_a8,__format,pcVar5,0x2f,pcVar4,(ulong)(uint)update);
      goto LAB_001061de;
    }
  }
  if (delete_segments == 0) {
    pcVar4 = env_config("DSS_PATH",".");
    sprintf(local_a8,"%s%cdelete.%d",pcVar4,0x2f,(ulong)(uint)-unaff_EBX);
  }
  else {
    delete_segment = delete_segment + 1;
    pcVar4 = env_config("DSS_PATH",".");
    sprintf(local_a8,"%s%cdelete.u%d.%d",pcVar4,0x2f,(ulong)((uint)-unaff_EBX % 10000),
            (ulong)(uint)delete_segment);
  }
LAB_001061de:
  pFVar6 = fopen64(local_a8,"w");
  return (FILE *)pFVar6;
}

Assistant:

FILE *
print_prep(int table, int update)
{
	char upath[128];
	FILE *res;

	if (updates)
		{
		if (update > 0) /* updates */
			if ( insert_segments )
				{
				int this_segment;
				if(strcmp(tdefs[table].name,"orders.tbl"))
					this_segment=++insert_orders_segment;
				else 
					this_segment=++insert_lineitem_segment;
				sprintf(upath, "%s%c%s.u%d.%d", 
					env_config(PATH_TAG, PATH_DFLT),
					PATH_SEP, tdefs[table].name, update%10000,this_segment);
				}
			else
				{
				sprintf(upath, "%s%c%s.u%d",
				env_config(PATH_TAG, PATH_DFLT),
				PATH_SEP, tdefs[table].name, update);
				}
		else /* deletes */
			if ( delete_segments )
				{
				++delete_segment;
				sprintf(upath, "%s%cdelete.u%d.%d",
					env_config(PATH_TAG, PATH_DFLT), PATH_SEP, -update%10000,
					delete_segment);
				}
			else
				{
				sprintf(upath, "%s%cdelete.%d",
				env_config(PATH_TAG, PATH_DFLT), PATH_SEP, -update);
				}
		return(fopen(upath, "w"));
        }
    res = tbl_open(table, "w");
    OPEN_CHECK(res, tdefs[table].name);
    return(res);
}